

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_json_schema_list_predicate(char *predicate,lys_node_list *list,int *parsed)

{
  byte bVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  ulong uVar5;
  size_t __n;
  char *local_70;
  char *mod_name;
  char *pcStack_60;
  int mod_name_len;
  char *name;
  int *local_50;
  int local_44;
  int local_40;
  int nam_len;
  int has_predicate;
  
  _has_predicate = list;
  iVar2 = parse_schema_json_predicate
                    (predicate,&local_70,(int *)((long)&mod_name + 4),&stack0xffffffffffffffa0,
                     &local_44,(char **)0x0,(int *)0x0,&local_40);
  if (0 < iVar2) {
    __n = (size_t)local_44;
    nam_len = iVar2;
    iVar3 = strncmp(pcStack_60,".",__n);
    iVar2 = nam_len;
    if (iVar3 != 0) {
      *parsed = *parsed + nam_len;
      name = predicate;
      local_50 = parsed;
      ppuVar4 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar4 + (long)*pcStack_60 * 2 + 1) & 8) != 0) {
LAB_00113897:
        if (local_40 == 0) {
          return 0;
        }
        iVar2 = resolve_json_schema_list_predicate(name + (uint)nam_len,_has_predicate,local_50);
        return iVar2;
      }
      bVar1 = _has_predicate->keys_size;
      uVar5 = 0;
      do {
        if (bVar1 == uVar5) {
LAB_00113869:
          ly_vlog(_has_predicate->module->ctx,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,pcStack_60);
          return -1;
        }
        __s1 = _has_predicate->keys[uVar5]->name;
        iVar2 = strncmp(__s1,pcStack_60,__n);
        if ((iVar2 == 0) && (__s1[__n] == '\0')) {
          if (bVar1 != uVar5) goto LAB_00113897;
          goto LAB_00113869;
        }
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  ly_vlog(_has_predicate->module->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
          (ulong)(uint)(int)predicate[-(long)iVar2],predicate + -(long)iVar2);
  return -1;
}

Assistant:

static int
resolve_json_schema_list_predicate(const char *predicate, const struct lys_node_list *list, int *parsed)
{
    const char *mod_name, *name;
    int mod_name_len, nam_len, has_predicate, i;
    struct lys_node *key;

    if (((i = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, NULL, NULL, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(list->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-i], &predicate[-i]);
        return -1;
    }

    predicate += i;
    *parsed += i;

    if (!isdigit(name[0])) {
        for (i = 0; i < list->keys_size; ++i) {
            key = (struct lys_node *)list->keys[i];
            if (!strncmp(key->name, name, nam_len) && !key->name[nam_len]) {
                break;
            }
        }

        if (i == list->keys_size) {
            LOGVAL(list->module->ctx, LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }
    }

    /* more predicates? */
    if (has_predicate) {
        return resolve_json_schema_list_predicate(predicate, list, parsed);
    }

    return 0;
}